

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_large_unittest.cc
# Opt level: O0

void TryAllocExpectFail(size_t size)

{
  _func_void_ptr_unsigned_long *p_Var1;
  void *pvVar2;
  _func_void_ptr_void_ptr_unsigned_long *p_Var3;
  void *pvVar4;
  void *p3;
  void *p2;
  void *p1;
  size_t size_local;
  
  p_Var1 = __noopt<void*(*)(unsigned_long)noexcept>_void_____unsigned_long_noexcept__(malloc);
  pvVar2 = (*p_Var1)(size);
  if (pvVar2 != (void *)0x0) {
    syscall(1,2,"Check failed: p1 == nullptr\n",0x1c);
    abort();
  }
  p_Var1 = __noopt<void*(*)(unsigned_long)noexcept>_void_____unsigned_long_noexcept__(malloc);
  pvVar2 = (*p_Var1)(1);
  if (pvVar2 == (void *)0x0) {
    syscall(1,2,"Check failed: p2 != nullptr\n",0x1c);
    abort();
  }
  p_Var3 = __noopt<void*(*)(void*,unsigned_long)noexcept>_void_____void__unsigned_long_noexcept__
                     (realloc);
  pvVar4 = (*p_Var3)(pvVar2,size);
  if (pvVar4 != (void *)0x0) {
    syscall(1,2,"Check failed: p3 == nullptr\n",0x1c);
    abort();
  }
  free(pvVar2);
  return;
}

Assistant:

void TryAllocExpectFail(size_t size) {
  void* p1 = noopt(malloc)(size);
  CHECK(p1 == nullptr);

  void* p2 = noopt(malloc)(1);
  CHECK(p2 != nullptr);

  void* p3 = noopt(realloc)(p2, size);
  CHECK(p3 == nullptr);

  free(p2);
}